

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

Var Js::JavascriptNumber::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *constructor;
  RecyclableObject *obj;
  ScriptContext *pSVar7;
  char *scriptContext;
  JavascriptNumberObject *number;
  double dVar8;
  int in_stack_00000010;
  Arguments local_70;
  Var local_60;
  CallInfo local_58;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_58 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_58._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x16f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00ce94b1;
    *puVar5 = 0;
  }
  callInfo_local = local_58;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_58);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x176,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00ce94b1;
    *puVar5 = 0;
  }
  number = (JavascriptNumberObject *)&DAT_1000000000000;
  local_60 = CallInfo::GetNewTarget
                       ((uint)callInfo_local._0_4_ >> 0x18,(Var *)&stack0x00000018,
                        callInfo_local._0_4_ & 0xffffff);
  local_70.Info = callInfo_local;
  local_70.Values = (Type)&stack0x00000018;
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_70);
  if (((ulong)callInfo_local & 0xfffffe) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00ce94b1;
      *puVar5 = 0;
    }
    if ((((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) ||
       (pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1), (ulong)pvVar6 >> 0x32 != 0))
    {
      number = (JavascriptNumberObject *)Arguments::operator[]((Arguments *)&callInfo_local,1);
    }
    else {
      scriptContext = (char *)&callInfo_local;
      pvVar6 = Arguments::operator[]((Arguments *)scriptContext,1);
      bVar4 = VarIs<Js::JavascriptNumberObject>(pvVar6);
      pSVar7 = (ScriptContext *)Arguments::operator[]((Arguments *)scriptContext,1);
      if (bVar4) {
        pSVar7 = (ScriptContext *)VarTo<Js::JavascriptNumberObject>(pSVar7);
        dVar8 = JavascriptNumberObject::GetValue((JavascriptNumberObject *)pSVar7);
        number = (JavascriptNumberObject *)ToVarNoCheck(dVar8,pSVar7);
      }
      else {
        if (((ulong)pSVar7 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pSVar7 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          scriptContext =
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
          ;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar4) {
LAB_00ce94b1:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        if (((ulong)pSVar7 & 0xffff000000000000) == 0x1000000000000) {
          dVar8 = (double)(int)pSVar7;
        }
        else if (pSVar7 < (ScriptContext *)0x4000000000000) {
          dVar8 = JavascriptConversion::ToNumber_Full(pSVar7,pSVar1);
          scriptContext = (char *)pSVar7;
        }
        else {
          dVar8 = (double)((ulong)pSVar7 ^ 0xfffc000000000000);
        }
        number = (JavascriptNumberObject *)ToVarNoCheck(dVar8,(ScriptContext *)scriptContext);
      }
    }
  }
  if (((ulong)local_58 & 0x1000000) != 0) {
    number = JavascriptLibrary::CreateNumberObject
                       ((pSVar1->super_ScriptContextBase).javascriptLibrary,number);
  }
  if (bVar3) {
    constructor = VarTo<Js::RecyclableObject>(local_60);
    obj = VarTo<Js::RecyclableObject>(number);
    number = (JavascriptNumberObject *)
             JavascriptOperators::OrdinaryCreateFromConstructor
                       (constructor,obj,(DynamicObject *)0x0,pSVar1);
  }
  return number;
}

Assistant:

Var JavascriptNumber::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        //
        // Determine if called as a constructor or a function.
        //

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        Var result;

        if (args.Info.Count > 1)
        {
            if (TaggedInt::Is(args[1]) || JavascriptNumber::Is(args[1]))
            {
                result = args[1];
            }
            else if (VarIs<JavascriptNumberObject>(args[1]))
            {
                result = JavascriptNumber::ToVarNoCheck(VarTo<JavascriptNumberObject>(args[1])->GetValue(), scriptContext);
            }
            else
            {
                result = JavascriptNumber::ToVarNoCheck(JavascriptConversion::ToNumber(args[1], scriptContext), scriptContext);
            }
        }
        else
        {
            result = TaggedInt::ToVarUnchecked(0);
        }

        if (callInfo.Flags & CallFlags_New)
        {
            JavascriptNumberObject* obj = scriptContext->GetLibrary()->CreateNumberObject(result);
            result = obj;
        }

        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), VarTo<RecyclableObject>(result), nullptr, scriptContext) :
            result;
    }